

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_TimingResistantEqual::test_method(util_TimingResistantEqual *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  assertion_result *in_stack_fffffffffffff918;
  const_string *in_stack_fffffffffffff930;
  const_string *msg;
  size_t in_stack_fffffffffffff938;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff940;
  const_string *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  allocator<char> local_502;
  undefined1 local_501 [25];
  const_string local_4e8;
  undefined1 local_4d8 [16];
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [2];
  allocator<char> local_482;
  allocator<char> local_481;
  assertion_result local_480 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  allocator<char> local_402;
  allocator<char> local_401;
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [2];
  allocator<char> local_382;
  allocator<char> local_381;
  assertion_result local_380 [2];
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  allocator<char> local_302;
  allocator<char> local_301;
  assertion_result local_300 [2];
  const_string local_2c8 [2];
  lazy_ostream local_2a8 [2];
  allocator<char> local_282;
  allocator<char> local_281;
  assertion_result local_280 [2];
  const_string local_248 [2];
  lazy_ostream local_228 [2];
  allocator<char> local_202;
  allocator<char> local_201;
  assertion_result local_200 [21];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_200,local_228,local_248,0x1e8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_202);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_201);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2a8,local_2c8,0x1e9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_282);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_281);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_300,local_328,local_348,0x1ea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_302);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_301);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a8,local_3c8,0x1eb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_382);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_381);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_428,local_448,0x1ec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_402);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_401);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    in_stack_fffffffffffff95f =
         TimingResistantEqual<std::__cxx11::string>
                   (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    in_stack_fffffffffffff950 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4a8,local_4c8,0x1ed,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_482);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_481);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = local_4d8;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    file = &local_4e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff948,file,(size_t)line_num,msg);
    in_stack_fffffffffffff948 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_501;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               (char *)in_stack_fffffffffffff950,(allocator<char> *)in_stack_fffffffffffff948);
    TimingResistantEqual<std::__cxx11::string>(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
    in_stack_fffffffffffff918 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (basic_cstring<const_char> *)in_stack_fffffffffffff908);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
               (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (unsigned_long)in_stack_fffffffffffff908);
    in_stack_fffffffffffff908 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_501 + 1),local_528,local_548,0x1ee,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff908);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff908);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator(&local_502);
    std::__cxx11::string::~string(in_stack_fffffffffffff908);
    std::allocator<char>::~allocator((allocator<char> *)local_501);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TimingResistantEqual)
{
    BOOST_CHECK(TimingResistantEqual(std::string(""), std::string("")));
    BOOST_CHECK(!TimingResistantEqual(std::string("abc"), std::string("")));
    BOOST_CHECK(!TimingResistantEqual(std::string(""), std::string("abc")));
    BOOST_CHECK(!TimingResistantEqual(std::string("a"), std::string("aa")));
    BOOST_CHECK(!TimingResistantEqual(std::string("aa"), std::string("a")));
    BOOST_CHECK(TimingResistantEqual(std::string("abc"), std::string("abc")));
    BOOST_CHECK(!TimingResistantEqual(std::string("abc"), std::string("aba")));
}